

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryPipelineBarrierTests.cpp
# Opt level: O1

void __thiscall
vkt::memory::anon_unknown_0::ImageBlitFromImage::prepare
          (ImageBlitFromImage *this,PrepareContext *context)

{
  Move<vk::Handle<(vk::HandleType)9>_> *pMVar1;
  int iVar2;
  Context *pCVar3;
  InstanceInterface *vki;
  DeviceInterface *vk;
  VkPhysicalDevice physicalDevice;
  VkDevice device;
  VkImage obj;
  VkDeviceMemory obj_00;
  void *pvVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  VkResult VVar7;
  uint uVar8;
  deUint32 dVar9;
  int iVar10;
  VkDevice pVVar11;
  VkDeviceSize size;
  ulong uVar12;
  VkMemoryPropertyFlags in_stack_fffffffffffffe48;
  VkCommandBuffer commandBuffer;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_190;
  VkImageMemoryBarrier postImageBarrier;
  Move<vk::Handle<(vk::HandleType)9>_> local_128;
  undefined8 local_108;
  undefined4 local_100;
  int local_fc;
  int local_f8;
  undefined4 local_f4;
  VkDeviceMemory local_e8;
  Deleter<vk::Handle<(vk::HandleType)7>_> DStack_e0;
  VkQueue local_c8;
  VkCommandPool local_c0;
  VkBuffer local_b8;
  Deleter<vk::Handle<(vk::HandleType)8>_> DStack_b0;
  VkImageCreateInfo createInfo;
  Random rng;
  
  pCVar3 = context->m_context;
  vki = pCVar3->m_vki;
  vk = pCVar3->m_vkd;
  physicalDevice = pCVar3->m_physicalDevice;
  device = pCVar3->m_device;
  local_c8 = pCVar3->m_queue;
  local_c0.m_internal =
       (pCVar3->m_commandPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.
       m_internal;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_190,&pCVar3->m_queueFamilies);
  iVar2 = context->m_currentImageWidth;
  this->m_imageWidth = iVar2;
  iVar10 = context->m_currentImageHeight;
  this->m_imageHeight = iVar10;
  this->m_imageMemorySize = context->m_currentImageMemorySize;
  if (this->m_scale == BLIT_SCALE_20) {
    this->m_srcImageWidth = iVar2 / 2;
    iVar10 = iVar10 / 2;
  }
  else {
    if (this->m_scale != BLIT_SCALE_10) goto LAB_006782ad;
    this->m_srcImageWidth = iVar2;
  }
  this->m_srcImageHeight = iVar10;
LAB_006782ad:
  createInfo.sType = VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO;
  createInfo.pNext = (void *)0x0;
  createInfo.flags = 0;
  createInfo.imageType = VK_IMAGE_TYPE_2D;
  createInfo.extent.width = this->m_srcImageWidth;
  createInfo.format = VK_FORMAT_R8G8B8A8_UNORM;
  createInfo.extent.height = this->m_srcImageHeight;
  createInfo.extent.depth = 1;
  createInfo.mipLevels = 1;
  createInfo.arrayLayers = 1;
  createInfo.samples = VK_SAMPLE_COUNT_1_BIT;
  createInfo.tiling = VK_IMAGE_TILING_OPTIMAL;
  createInfo.usage = 3;
  createInfo.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
  createInfo.queueFamilyIndexCount =
       (deUint32)
       ((ulong)((long)local_190.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
               (long)local_190.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start) >> 2);
  createInfo.pQueueFamilyIndices =
       local_190.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_start;
  createInfo.initialLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  ::vk::createImage(&local_128,vk,device,&createInfo,(VkAllocationCallbacks *)0x0);
  postImageBarrier._16_8_ =
       local_128.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_device;
  postImageBarrier._24_8_ =
       local_128.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator;
  postImageBarrier._0_8_ =
       local_128.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal;
  postImageBarrier.pNext =
       local_128.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_deviceIface;
  local_128.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal = 0;
  local_128.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_128.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_128.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  obj.m_internal =
       (this->m_srcImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal;
  if (obj.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)9>_>::operator()
              (&(this->m_srcImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter,obj)
    ;
  }
  pMVar1 = &this->m_srcImage;
  (this->m_srcImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_device =
       (VkDevice)postImageBarrier._16_8_;
  (this->m_srcImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)postImageBarrier._24_8_;
  (pMVar1->super_RefBase<vk::Handle<(vk::HandleType)9>_>).m_data.object.m_internal =
       postImageBarrier._0_8_;
  (this->m_srcImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)postImageBarrier.pNext;
  if (local_128.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)9>_>::operator()
              (&local_128.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter,
               (VkImage)local_128.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
                        m_internal);
  }
  bindImageMemory((Move<vk::Handle<(vk::HandleType)7>_> *)&postImageBarrier,vki,vk,physicalDevice,
                  device,(VkImage)(pMVar1->super_RefBase<vk::Handle<(vk::HandleType)9>_>).m_data.
                                  object.m_internal,in_stack_fffffffffffffe48);
  createInfo.flags = postImageBarrier.srcAccessMask;
  createInfo.imageType = postImageBarrier.dstAccessMask;
  createInfo.format = postImageBarrier.oldLayout;
  createInfo.extent.width = postImageBarrier.newLayout;
  createInfo.sType = postImageBarrier.sType;
  createInfo._4_4_ = postImageBarrier._4_4_;
  createInfo.pNext = postImageBarrier.pNext;
  postImageBarrier.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  postImageBarrier._4_4_ = 0;
  postImageBarrier.pNext = (void *)0x0;
  postImageBarrier.srcAccessMask = 0;
  postImageBarrier.dstAccessMask = 0;
  postImageBarrier.oldLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  postImageBarrier.newLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  obj_00.m_internal =
       (this->m_memory).super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.m_internal;
  if (obj_00.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)7>_>::operator()
              (&(this->m_memory).super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter,obj_00
              );
  }
  (this->m_memory).super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_device =
       (VkDevice)createInfo._16_8_;
  (this->m_memory).super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)createInfo._24_8_;
  (this->m_memory).super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.m_internal =
       createInfo._0_8_;
  (this->m_memory).super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)createInfo.pNext;
  if (postImageBarrier._0_8_ != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)7>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)7>_> *)&postImageBarrier.pNext,
               (VkDeviceMemory)postImageBarrier._0_8_);
  }
  createInfo._24_8_ = SEXT48(this->m_srcImageWidth * this->m_srcImageHeight * 4);
  createInfo.sType = VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO;
  createInfo.pNext = (void *)0x0;
  createInfo._16_8_ = createInfo._16_8_ & 0xffffffff00000000;
  createInfo.extent.height = 1;
  createInfo.extent.depth = 0;
  createInfo.mipLevels =
       (deUint32)
       ((ulong)((long)local_190.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
               (long)local_190.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start) >> 2);
  createInfo.samples =
       (VkSampleCountFlagBits)
       local_190.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_start;
  createInfo.tiling =
       (VkImageTiling)
       ((ulong)local_190.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start >> 0x20);
  ::vk::createBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)&postImageBarrier,vk,device,
                     (VkBufferCreateInfo *)&createInfo,(VkAllocationCallbacks *)0x0);
  local_b8.m_internal = postImageBarrier._0_8_;
  DStack_b0.m_deviceIface = (DeviceInterface *)postImageBarrier.pNext;
  DStack_b0.m_device = (VkDevice)postImageBarrier._16_8_;
  DStack_b0.m_allocator = (VkAllocationCallbacks *)postImageBarrier._24_8_;
  pVVar11 = device;
  bindBufferMemory((Move<vk::Handle<(vk::HandleType)7>_> *)&createInfo,vki,vk,physicalDevice,device,
                   (VkBuffer)postImageBarrier._0_8_,in_stack_fffffffffffffe48);
  DStack_e0.m_device = (VkDevice)createInfo._16_8_;
  DStack_e0.m_allocator = (VkAllocationCallbacks *)createInfo._24_8_;
  local_e8.m_internal = createInfo._0_8_;
  DStack_e0.m_deviceIface = (DeviceInterface *)createInfo.pNext;
  createBeginCommandBuffer
            ((Move<vk::VkCommandBuffer_s_*> *)&createInfo,vk,device,local_c0,
             (VkCommandBufferLevel)pVVar11);
  uVar6 = createInfo._24_8_;
  uVar5 = createInfo._16_8_;
  pvVar4 = createInfo.pNext;
  commandBuffer = (VkCommandBuffer)createInfo._0_8_;
  createInfo.sType = VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER;
  createInfo.pNext = (void *)0x0;
  createInfo.flags = 0;
  createInfo.imageType = 0x1000;
  createInfo.format = VK_FORMAT_UNDEFINED;
  createInfo.extent.width = 7;
  createInfo.extent.height = 0xffffffff;
  createInfo.extent.depth = 0xffffffff;
  postImageBarrier.image.m_internal =
       (this->m_srcImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal;
  createInfo.mipLevels = (deUint32)postImageBarrier.image.m_internal;
  createInfo.arrayLayers = (deUint32)(postImageBarrier.image.m_internal >> 0x20);
  createInfo.samples = VK_SAMPLE_COUNT_1_BIT;
  createInfo.tiling = VK_IMAGE_TILING_OPTIMAL;
  createInfo.usage = 1;
  createInfo.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
  createInfo.queueFamilyIndexCount = 1;
  postImageBarrier.sType = VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER;
  postImageBarrier.pNext = (void *)0x0;
  postImageBarrier.srcAccessMask = 0x1000;
  postImageBarrier.dstAccessMask = 0;
  postImageBarrier.oldLayout = VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL;
  postImageBarrier.newLayout = VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL;
  postImageBarrier.srcQueueFamilyIndex = 0xffffffff;
  postImageBarrier.dstQueueFamilyIndex = 0xffffffff;
  postImageBarrier.subresourceRange.aspectMask = 1;
  postImageBarrier.subresourceRange.baseMipLevel = 0;
  postImageBarrier.subresourceRange.levelCount = 1;
  postImageBarrier.subresourceRange.baseArrayLayer = 0;
  postImageBarrier.subresourceRange.layerCount = 1;
  local_128.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal = 0;
  local_128.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_128.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_device =
       (VkDevice)&DAT_00000001;
  local_128.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x100000000;
  local_108 = 0;
  local_100 = 0;
  local_fc = this->m_srcImageWidth;
  local_f8 = this->m_srcImageHeight;
  local_f4 = 1;
  VVar7 = (*vk->_vptr_DeviceInterface[7])
                    (vk,device,local_e8.m_internal,0,(long)(local_fc * local_f8 * 4),0,&rng);
  ::vk::checkResult(VVar7,"vkd.mapMemory(device, memory, 0, size, 0, &ptr)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/memory/vktMemoryPipelineBarrierTests.cpp"
                    ,0x2b3);
  deRandom_init(&rng.m_rnd,this->m_seed);
  uVar8 = this->m_srcImageWidth * this->m_srcImageHeight;
  if ((uVar8 & 0x3fffffff) == 0) {
    size = (VkDeviceSize)(int)(uVar8 * 4);
  }
  else {
    uVar12 = 0;
    do {
      dVar9 = deRandom_getUint32(&rng.m_rnd);
      *(char *)(rng.m_rnd._0_8_ + uVar12) = (char)dVar9;
      uVar12 = uVar12 + 1;
      size = (VkDeviceSize)(this->m_srcImageWidth * this->m_srcImageHeight * 4);
    } while (uVar12 < size);
  }
  ::vk::flushMappedMemoryRange(vk,device,local_e8,0,size);
  (*vk->_vptr_DeviceInterface[8])(vk,device,local_e8.m_internal);
  (*vk->_vptr_DeviceInterface[0x6d])(vk,commandBuffer,0x10000,0x1000,0,0,0,0,0,1,&createInfo);
  (*vk->_vptr_DeviceInterface[0x62])
            (vk,commandBuffer,local_b8.m_internal,
             (pMVar1->super_RefBase<vk::Handle<(vk::HandleType)9>_>).m_data.object.m_internal,7,1,
             &local_128);
  (*vk->_vptr_DeviceInterface[0x6d])(vk,commandBuffer,0x1000,0x1000,0,0,0,0,0,1,&postImageBarrier);
  VVar7 = (*vk->_vptr_DeviceInterface[0x4a])(vk,commandBuffer);
  ::vk::checkResult(VVar7,"vkd.endCommandBuffer(*commandBuffer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/memory/vktMemoryPipelineBarrierTests.cpp"
                    ,0xecd);
  queueRun(vk,local_c8,commandBuffer);
  if (commandBuffer != (VkCommandBuffer)0x0) {
    createInfo._0_8_ = commandBuffer;
    (**(code **)(*pvVar4 + 0x240))(pvVar4,uVar5,uVar6,1);
  }
  if (local_e8.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)7>_>::operator()(&DStack_e0,local_e8);
  }
  if (local_b8.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()(&DStack_b0,local_b8);
  }
  if (local_190.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (deUint32 *)0x0) {
    operator_delete(local_190.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_190.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_190.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void ImageBlitFromImage::prepare (PrepareContext& context)
{
	const vk::InstanceInterface&	vki				= context.getContext().getInstanceInterface();
	const vk::DeviceInterface&		vkd				= context.getContext().getDeviceInterface();
	const vk::VkPhysicalDevice		physicalDevice	= context.getContext().getPhysicalDevice();
	const vk::VkDevice				device			= context.getContext().getDevice();
	const vk::VkQueue				queue			= context.getContext().getQueue();
	const vk::VkCommandPool			commandPool		= context.getContext().getCommandPool();
	const vector<deUint32>&			queueFamilies	= context.getContext().getQueueFamilies();

	m_imageWidth		= context.getImageWidth();
	m_imageHeight		= context.getImageHeight();
	m_imageMemorySize	= context.getImageMemorySize();

	if (m_scale == BLIT_SCALE_10)
	{
		m_srcImageWidth			= m_imageWidth;
		m_srcImageHeight		= m_imageHeight;
	}
	else if (m_scale == BLIT_SCALE_20)
	{
		m_srcImageWidth			= m_imageWidth / 2;
		m_srcImageHeight		= m_imageHeight / 2;
	}
	else
		DE_FATAL("Unsupported scale");

	{
		const vk::VkImageCreateInfo	createInfo =
		{
			vk::VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO,
			DE_NULL,

			0,
			vk::VK_IMAGE_TYPE_2D,
			vk::VK_FORMAT_R8G8B8A8_UNORM,
			{
				(deUint32)m_srcImageWidth,
				(deUint32)m_srcImageHeight,
				1u,
			},
			1, 1, // mipLevels, arrayLayers
			vk::VK_SAMPLE_COUNT_1_BIT,

			vk::VK_IMAGE_TILING_OPTIMAL,
			vk::VK_IMAGE_USAGE_TRANSFER_DST_BIT|vk::VK_IMAGE_USAGE_TRANSFER_SRC_BIT,
			vk::VK_SHARING_MODE_EXCLUSIVE,

			(deUint32)queueFamilies.size(),
			&queueFamilies[0],
			vk::VK_IMAGE_LAYOUT_UNDEFINED
		};

		m_srcImage = vk::createImage(vkd, device, &createInfo);
	}

	m_memory = bindImageMemory(vki, vkd, physicalDevice, device, *m_srcImage, 0);

	{
		const vk::Unique<vk::VkBuffer>			srcBuffer		(createBuffer(vkd, device, 4 * m_srcImageWidth * m_srcImageHeight, vk::VK_BUFFER_USAGE_TRANSFER_SRC_BIT, vk::VK_SHARING_MODE_EXCLUSIVE, queueFamilies));
		const vk::Unique<vk::VkDeviceMemory>	memory			(bindBufferMemory(vki, vkd, physicalDevice, device, *srcBuffer, vk::VK_MEMORY_PROPERTY_HOST_VISIBLE_BIT));
		const vk::Unique<vk::VkCommandBuffer>	commandBuffer	(createBeginCommandBuffer(vkd, device, commandPool, vk::VK_COMMAND_BUFFER_LEVEL_PRIMARY));
		const vk::VkImageMemoryBarrier			preImageBarrier	=
		{
			vk::VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER,
			DE_NULL,

			0,
			vk::VK_ACCESS_TRANSFER_WRITE_BIT,

			vk::VK_IMAGE_LAYOUT_UNDEFINED,
			vk::VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,

			VK_QUEUE_FAMILY_IGNORED,
			VK_QUEUE_FAMILY_IGNORED,

			*m_srcImage,
			{
				vk::VK_IMAGE_ASPECT_COLOR_BIT,
				0,	// Mip level
				1,	// Mip level count
				0,	// Layer
				1	// Layer count
			}
		};
		const vk::VkImageMemoryBarrier			postImageBarrier =
		{
			vk::VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER,
			DE_NULL,

			vk::VK_ACCESS_TRANSFER_WRITE_BIT,
			0,

			vk::VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,
			vk::VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,

			VK_QUEUE_FAMILY_IGNORED,
			VK_QUEUE_FAMILY_IGNORED,

			*m_srcImage,
			{
				vk::VK_IMAGE_ASPECT_COLOR_BIT,
				0,	// Mip level
				1,	// Mip level count
				0,	// Layer
				1	// Layer count
			}
		};
		const vk::VkBufferImageCopy				region				=
		{
			0,
			0, 0,
			{
				vk::VK_IMAGE_ASPECT_COLOR_BIT,
				0,	// mipLevel
				0,	// arrayLayer
				1	// layerCount
			},
			{ 0, 0, 0 },
			{
				(deUint32)m_srcImageWidth,
				(deUint32)m_srcImageHeight,
				1u
			}
		};

		{
			void* const	ptr	= mapMemory(vkd, device, *memory, 4 * m_srcImageWidth * m_srcImageHeight);
			de::Random	rng	(m_seed);

			{
				deUint8* const	data = (deUint8*)ptr;

				for (size_t ndx = 0; ndx < (size_t)(4 * m_srcImageWidth * m_srcImageHeight); ndx++)
					data[ndx] = rng.getUint8();
			}

			vk::flushMappedMemoryRange(vkd, device, *memory, 0, 4 * m_srcImageWidth * m_srcImageHeight);
			vkd.unmapMemory(device, *memory);
		}

		vkd.cmdPipelineBarrier(*commandBuffer, vk::VK_PIPELINE_STAGE_ALL_COMMANDS_BIT, vk::VK_PIPELINE_STAGE_TRANSFER_BIT, (vk::VkDependencyFlags)0, 0, (const vk::VkMemoryBarrier*)DE_NULL, 0, (const vk::VkBufferMemoryBarrier*)DE_NULL, 1, &preImageBarrier);
		vkd.cmdCopyBufferToImage(*commandBuffer, *srcBuffer, *m_srcImage, vk::VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL, 1, &region);
		vkd.cmdPipelineBarrier(*commandBuffer, vk::VK_PIPELINE_STAGE_TRANSFER_BIT, vk::VK_PIPELINE_STAGE_TRANSFER_BIT, (vk::VkDependencyFlags)0, 0, (const vk::VkMemoryBarrier*)DE_NULL, 0, (const vk::VkBufferMemoryBarrier*)DE_NULL, 1, &postImageBarrier);

		VK_CHECK(vkd.endCommandBuffer(*commandBuffer));
		queueRun(vkd, queue, *commandBuffer);
	}
}